

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_open_file.c
# Opt level: O0

wchar_t file_close(archive *a,void *client_data)

{
  int *in_RSI;
  write_file_data *mine;
  
  close(*in_RSI);
  archive_mstring_clean((archive_mstring *)0x28d29f);
  free(in_RSI);
  return L'\0';
}

Assistant:

static int
file_close(struct archive *a, void *client_data)
{
	struct read_FILE_data *mine = (struct read_FILE_data *)client_data;

	(void)a; /* UNUSED */
	if (mine->buffer != NULL)
		free(mine->buffer);
	free(mine);
	return (ARCHIVE_OK);
}